

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

int cargo_fprintl_args(FILE *f,int argc,char **argv,int start,cargo_fprint_flags_t flags,
                      size_t max_width,size_t highlight_count,cargo_highlight_t *highlights)

{
  char *__ptr;
  int iVar1;
  
  __ptr = cargo_get_fprintl_args(argc,argv,start,flags,max_width,highlight_count,highlights);
  if (__ptr == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    fprintf((FILE *)f,"%s\n",__ptr);
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(__ptr);
    }
    else {
      (*replaced_cargo_free)(__ptr);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int cargo_fprintl_args(FILE *f, int argc, char **argv, int start,
                       cargo_fprint_flags_t flags,
                       size_t max_width, size_t highlight_count,
                       const cargo_highlight_t *highlights)
{
    char *ret;
    if (!(ret = cargo_get_fprintl_args(argc, argv, start, flags,
                                max_width, highlight_count, highlights)))
    {
        return -1;
    }

    fprintf(f, "%s\n", ret);
    _cargo_free(ret);
    return 0;
}